

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

int sexp_buffered_write_string_n(sexp ctx,char *str,sexp_uint_t len,sexp p)

{
  int iVar1;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int written;
  int res;
  int diff;
  int local_34;
  size_t local_20;
  void *local_18;
  int local_4;
  
  local_34 = 0;
  local_18 = in_RSI;
  for (local_20 = in_RDX; *(ulong *)(in_RCX + 0x50) <= *(long *)(in_RCX + 0x38) + local_20;
      local_20 = local_20 - (long)local_4) {
    local_4 = (int)*(undefined8 *)(in_RCX + 0x50) - (int)*(undefined8 *)(in_RCX + 0x38);
    memcpy((void *)(*(long *)(in_RCX + 0x28) + *(long *)(in_RCX + 0x38)),local_18,(long)local_4);
    *(undefined8 *)(in_RCX + 0x38) = *(undefined8 *)(in_RCX + 0x50);
    iVar1 = sexp_buffered_flush((sexp)len,p,diff);
    if (iVar1 != 0) goto LAB_001165b2;
    local_34 = local_34 + (int)*(undefined8 *)(in_RCX + 0x50);
    local_18 = (void *)((long)local_18 + (long)local_4);
  }
  memcpy((void *)(*(long *)(in_RCX + 0x28) + *(long *)(in_RCX + 0x38)),local_18,local_20);
  *(size_t *)(in_RCX + 0x38) = local_20 + *(long *)(in_RCX + 0x38);
  local_4 = (int)local_20;
LAB_001165b2:
  local_4 = local_34 + local_4;
  return local_4;
}

Assistant:

int sexp_buffered_write_string_n (sexp ctx, const char *str,
                                  sexp_uint_t len, sexp p) {
  int diff, res, written=0;
  while (sexp_port_offset(p)+len >= sexp_port_size(p)) {
    diff = sexp_port_size(p) - sexp_port_offset(p);
    memcpy(sexp_port_buf(p)+sexp_port_offset(p), str, diff);
    sexp_port_offset(p) = sexp_port_size(p);
    if ((res = sexp_buffered_flush(ctx, p, 0)))
      return written + diff;
    written += sexp_port_size(p);
    str += diff;
    len -= diff;
  }
  memcpy(sexp_port_buf(p)+sexp_port_offset(p), str, len);
  sexp_port_offset(p) += len;
  return written + len;
}